

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::ScissorCase::iterate(ScissorCase *this)

{
  TextureFormat log;
  RenderContext *pRVar1;
  int y;
  bool bVar2;
  int i;
  int iVar3;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  long lVar7;
  undefined4 extraout_var_01;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char *description;
  uint uVar12;
  qpTestResult testResult;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  RandomViewport viewport;
  Surface refImage;
  IVec4 absScissorArea;
  Surface resImage;
  IVec4 relScissorArea;
  Vec4 threshold;
  Vector<float,_4> res;
  ShaderProgram shader;
  RandomViewport local_328;
  Surface local_318;
  Vector<int,_4> local_300;
  Surface local_2f0;
  IVec4 local_2d8;
  ConstPixelBufferAccess local_2c8;
  TextureFormat local_2a0;
  Vec4 local_298;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8 [9];
  ShaderProgram local_100;
  long lVar5;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar7 = CONCAT44(extraout_var_00,iVar3);
  uVar8 = 8 - *(int *)(lVar7 + 8);
  uVar12 = 8 - *(int *)(lVar7 + 0xc);
  uVar14 = 8 - *(int *)(lVar7 + 0x10);
  uVar10 = 8 - *(int *)(lVar7 + 0x14);
  uVar6 = 0;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar6;
  }
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar6;
  }
  uVar15 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar15 = uVar6;
  }
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar6;
  }
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1 << ((byte)uVar9 & 0x1f);
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 1 << ((byte)uVar13 & 0x1f);
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1 << ((byte)uVar15 & 0x1f);
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 1 << ((byte)uVar11 & 0x1f);
  local_288._0_4_ = R;
  local_288._4_4_ = SNORM_INT8;
  uStack_280 = (pointer)0x0;
  do {
    *(float *)(local_288 + uVar6 * 4) =
         (float)*(uint *)((long)&local_100.m_shaders[0].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar6 * 4);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 4);
  local_298.m_data[0] = 0.0;
  local_298.m_data[1] = 0.0;
  local_298.m_data[2] = 0.0;
  local_298.m_data[3] = 0.0;
  lVar7 = 0;
  do {
    local_298.m_data[lVar7] = *(float *)(local_288 + lVar7 * 4) * 0.02;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  pRVar1 = this->m_renderCtx;
  type.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])(pRVar1);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders((ProgramSources *)local_288,version);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar1,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  TextureTestUtil::RandomViewport::RandomViewport
            (&local_328,(RenderTarget *)CONCAT44(extraout_var_01,iVar3),0x100,0x100,dVar4);
  local_2d8.m_data[0] = (int)((this->m_scissorArea).m_data[0] * (float)local_328.width);
  local_2d8.m_data[1] = (int)((this->m_scissorArea).m_data[1] * (float)local_328.height);
  local_300.m_data[2] = (int)((float)local_328.width * (this->m_scissorArea).m_data[2]);
  local_300.m_data[3] = (int)((float)local_328.height * (this->m_scissorArea).m_data[3]);
  local_300.m_data[0] = local_2d8.m_data[0] + local_328.x;
  local_300.m_data[1] = local_2d8.m_data[1] + local_328.y;
  local_2d8.m_data[2] = local_300.m_data[2];
  local_2d8.m_data[3] = local_300.m_data[3];
  tcu::Surface::Surface(&local_318,local_328.width,local_328.height);
  tcu::Surface::Surface(&local_2f0,local_328.width,local_328.height);
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<((TestLog *)log,&local_100);
    description = "Shader compile/link failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Viewport area is ",0x11);
    tcu::operator<<((ostream *)&uStack_280,(Vector<int,_4> *)&local_2c8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Scissor area is ",0x10);
    tcu::operator<<((ostream *)&uStack_280,&local_300);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Rendering reference (scissors disabled)",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar5 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar5 + 0x1a00))(local_328.x,local_328.y,local_328.width,local_328.height);
    (**(code **)(lVar5 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
    (**(code **)(lVar5 + 0x1d0))(0x3f800000);
    (**(code **)(lVar5 + 0x208))(0);
    (**(code **)(lVar5 + 0x4e8))(0xb71);
    (**(code **)(lVar5 + 0x4e8))(0xb90);
    (**(code **)(lVar5 + 0x4e8))(0xc11);
    (**(code **)(lVar5 + 0x188))(0x4500);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)local_100.m_program.m_program);
    y = local_328.y;
    iVar3 = local_328.x;
    pRVar1 = this->m_renderCtx;
    local_2c8.m_format.order = RGBA;
    local_2c8.m_format.type = UNORM_INT8;
    pvVar16 = (void *)local_318.m_pixels.m_cap;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      pvVar16 = local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2c8.m_format,local_318.m_width,
               local_318.m_height,1,pvVar16);
    glu::readPixels(pRVar1,iVar3,y,(PixelBufferAccess *)local_288);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0xf5);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Rendering result (scissors enabled)",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar5 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar5 + 0x1a00))(local_328.x,local_328.y,local_328.width,local_328.height);
    (**(code **)(lVar5 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
    (**(code **)(lVar5 + 0x1d0))(0x3f800000);
    (**(code **)(lVar5 + 0x208))(0);
    (**(code **)(lVar5 + 0x4e8))(0xb71);
    (**(code **)(lVar5 + 0x4e8))(0xb90);
    (**(code **)(lVar5 + 0x4e8))(0xc11);
    (**(code **)(lVar5 + 0x188))(0x4500);
    (**(code **)(lVar5 + 0x1290))
              (local_300.m_data[0],local_300.m_data[1],local_300.m_data[2],local_300.m_data[3]);
    (**(code **)(lVar5 + 0x5e0))(0xc11);
    uStack_280 = (pointer)CONCAT44(local_328.height,local_328.width);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)local_100.m_program.m_program);
    pRVar1 = this->m_renderCtx;
    local_2c8.m_format.order = RGBA;
    local_2c8.m_format.type = UNORM_INT8;
    pvVar16 = (void *)local_2f0.m_pixels.m_cap;
    if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
      pvVar16 = local_2f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2c8.m_format,local_2f0.m_width,
               local_2f0.m_height,1,pvVar16);
    glu::readPixels(pRVar1,local_328.x,local_328.y,(PixelBufferAccess *)local_288);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x10d);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Clearing area outside scissor area from reference",0x31);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    local_2c8.m_format.order = RGBA;
    local_2c8.m_format.type = UNORM_INT8;
    pvVar16 = (void *)local_318.m_pixels.m_cap;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      pvVar16 = local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2c8.m_format,local_318.m_width,
               local_318.m_height,1,pvVar16);
    local_2c8.m_format.order = 0x20;
    local_2c8.m_format.type = 0x40;
    local_2c8.m_size.m_data[0] = 0x80;
    local_2c8.m_size.m_data[1] = 0xff;
    Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
              ((PixelBufferAccess *)local_288,(Vector<int,_4> *)&local_2c8,&local_2d8);
    local_2c8.m_format.order = RGBA;
    local_2c8.m_format.type = UNORM_INT8;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      local_318.m_pixels.m_cap = (size_t)local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,&local_2c8.m_format,local_318.m_width,
               local_318.m_height,1,(void *)local_318.m_pixels.m_cap);
    local_2a0.order = RGBA;
    local_2a0.type = UNORM_INT8;
    if ((void *)local_2f0.m_pixels.m_cap != (void *)0x0) {
      local_2f0.m_pixels.m_cap = (size_t)local_2f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_2c8,&local_2a0,local_2f0.m_width,local_2f0.m_height,1,
               (void *)local_2f0.m_pixels.m_cap);
    bVar2 = tcu::floatThresholdCompare
                      ((TestLog *)log,"ComparisonResult","Image comparison result",
                       (ConstPixelBufferAccess *)local_288,&local_2c8,&local_298,COMPARE_LOG_RESULT)
    ;
    testResult = (qpTestResult)!bVar2;
    description = "Image comparison failed";
    if (bVar2) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&local_2f0);
  tcu::Surface::~Surface(&local_318);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

ScissorCase::IterateResult ScissorCase::iterate (void)
{
	using TextureTestUtil::RandomViewport;

	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	TestLog&					log				= m_testCtx.getLog();
	const tcu::PixelFormat		renderFormat	= m_renderCtx.getRenderTarget().getPixelFormat();
	const tcu::Vec4				threshold		= 0.02f * UVec4(1u << de::max(0, 8 - renderFormat.redBits),
																1u << de::max(0, 8 - renderFormat.greenBits),
																1u << de::max(0, 8 - renderFormat.blueBits),
																1u << de::max(0, 8 - renderFormat.alphaBits)).asFloat();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const RandomViewport		viewport		(m_renderCtx.getRenderTarget(), 256, 256, deStringHash(getName()));
	const IVec4					relScissorArea	(int(m_scissorArea.x() * (float)viewport.width),
												 int(m_scissorArea.y() * (float)viewport.height),
												 int(m_scissorArea.z() * (float)viewport.width),
												 int(m_scissorArea.w() * (float)viewport.height));
	const IVec4					absScissorArea	(relScissorArea.x() + viewport.x,
												 relScissorArea.y() + viewport.y,
												 relScissorArea.z(),
												 relScissorArea.w());

	tcu::Surface				refImage		(viewport.width, viewport.height);
	tcu::Surface				resImage		(viewport.width, viewport.height);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	log << TestLog::Message << "Viewport area is " << IVec4(viewport.x, viewport.y, viewport.width, viewport.height) << TestLog::EndMessage;
	log << TestLog::Message << "Scissor area is " << absScissorArea << TestLog::EndMessage;

	// Render reference (no scissors)
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, refImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result (scissors)
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

		gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
		gl.clearDepthf(1.0f);
		gl.clearStencil(0);
		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);
		gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);

		gl.scissor(absScissorArea.x(), absScissorArea.y(), absScissorArea.z(), absScissorArea.w());
		gl.enable(GL_SCISSOR_TEST);

		render(shader.getProgram(), IVec4(viewport.x, viewport.y, viewport.width, viewport.height));

		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resImage.getAccess());
		GLU_CHECK_ERROR(gl.getError());
	}

	// Manual 'scissors' for reference image
	log << TestLog::Message << "Clearing area outside scissor area from reference" << TestLog::EndMessage;
	clearEdges(refImage.getAccess(), IVec4(32, 64, 128, 255), relScissorArea);

	if (tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refImage.getAccess(), resImage.getAccess(), threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}